

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void __thiscall btSoftBody::LJoint::Prepare(LJoint *this,btScalar dt,int iterations)

{
  Body *this_00;
  Body *this_01;
  btVector3 *v;
  btVector3 *v1;
  btVector3 *v2;
  float fVar1;
  btRigidBody *pbVar2;
  btTransform *pbVar3;
  btMatrix3x3 *iia;
  btScalar *pbVar4;
  btMatrix3x3 *iib;
  btScalar bVar5;
  float fVar6;
  btScalar imb;
  float fVar7;
  float fVar8;
  btVector3 bVar9;
  btScalar local_7c;
  btVector3 local_78;
  float local_64;
  btMatrix3x3 local_60;
  
  local_7c = dt;
  Joint::Prepare(&this->super_Joint,dt,iterations);
  this_00 = (this->super_Joint).m_bodies;
  pbVar3 = Body::xform(this_00);
  bVar9 = btTransform::operator()(pbVar3,(this->super_Joint).m_refs);
  v1 = this->m_rpos;
  *&this->m_rpos[0].m_floats = bVar9.m_floats;
  this_01 = (this->super_Joint).m_bodies + 1;
  pbVar3 = Body::xform(this_01);
  bVar9 = btTransform::operator()(pbVar3,(this->super_Joint).m_refs + 1);
  v2 = this->m_rpos + 1;
  *&this->m_rpos[1].m_floats = bVar9.m_floats;
  local_78 = operator-(v1,v2);
  bVar5 = btVector3::length2(&local_78);
  fVar6 = local_78.m_floats[0];
  fVar7 = local_78.m_floats[1];
  fVar8 = local_78.m_floats[2];
  if (16.0 < bVar5) {
    local_60.m_el[0].m_floats[1] = fVar7 * 4.0;
    local_60.m_el[0].m_floats[0] = fVar6 * 4.0;
    local_60.m_el[0].m_floats[2] = local_78.m_floats[2] * 4.0;
    local_60.m_el[0].m_floats[3] = 0.0;
    if (bVar5 < 0.0) {
      local_64 = sqrtf(bVar5);
    }
    else {
      local_64 = SQRT(bVar5);
    }
    bVar9 = operator/(local_60.m_el,&local_64);
    fVar6 = bVar9.m_floats[0];
    fVar7 = bVar9.m_floats[1];
    fVar8 = bVar9.m_floats[2];
  }
  fVar1 = (this->super_Joint).m_erp;
  local_60.m_el[0].m_floats[1] = fVar1 * fVar7;
  local_60.m_el[0].m_floats[0] = fVar1 * fVar6;
  local_60.m_el[0].m_floats[2] = fVar8 * fVar1;
  local_60.m_el[0].m_floats[3] = 0.0;
  bVar9 = operator/(local_60.m_el,&local_7c);
  *&(this->super_Joint).m_drift.m_floats = bVar9.m_floats;
  pbVar3 = Body::xform(this_00);
  btVector3::operator-=(v1,&pbVar3->m_origin);
  pbVar3 = Body::xform(this_01);
  btVector3::operator-=(v2,&pbVar3->m_origin);
  pbVar2 = (this->super_Joint).m_bodies[0].m_rigid;
  if (pbVar2 == (btRigidBody *)0x0) {
    if (this_00->m_soft != (Cluster *)0x0) {
      pbVar4 = &this_00->m_soft->m_imass;
      goto LAB_001a2318;
    }
    bVar5 = 0.0;
  }
  else {
    pbVar4 = &pbVar2->m_inverseMass;
LAB_001a2318:
    bVar5 = *pbVar4;
  }
  iia = Body::invWorldInertia(this_00);
  pbVar2 = (this->super_Joint).m_bodies[1].m_rigid;
  if (pbVar2 == (btRigidBody *)0x0) {
    if (this_01->m_soft == (Cluster *)0x0) {
      imb = 0.0;
      goto LAB_001a2355;
    }
    pbVar4 = &this_01->m_soft->m_imass;
  }
  else {
    pbVar4 = &pbVar2->m_inverseMass;
  }
  imb = *pbVar4;
LAB_001a2355:
  v = &(this->super_Joint).m_drift;
  iib = Body::invWorldInertia(this_01);
  ImpulseMatrix(&local_60,bVar5,iia,v1,imb,iib,v2);
  *(undefined8 *)(this->super_Joint).m_massmatrix.m_el[0].m_floats = local_60.m_el[0].m_floats._0_8_
  ;
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[0].m_floats + 2) =
       local_60.m_el[0].m_floats._8_8_;
  *(undefined8 *)(this->super_Joint).m_massmatrix.m_el[1].m_floats = local_60.m_el[1].m_floats._0_8_
  ;
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[1].m_floats + 2) =
       local_60.m_el[1].m_floats._8_8_;
  *(undefined8 *)(this->super_Joint).m_massmatrix.m_el[2].m_floats = local_60.m_el[2].m_floats._0_8_
  ;
  *(undefined8 *)((this->super_Joint).m_massmatrix.m_el[2].m_floats + 2) =
       local_60.m_el[2].m_floats._8_8_;
  if (0.0 < (this->super_Joint).m_split) {
    local_60.m_el[0] = operator*(v,&(this->super_Joint).m_split);
    bVar9 = operator*(&(this->super_Joint).m_massmatrix,local_60.m_el);
    *&(this->super_Joint).m_sdrift.m_floats = bVar9.m_floats;
    local_60.m_el[0].m_floats[0] = 1.0 - (this->super_Joint).m_split;
    btVector3::operator*=(v,(btScalar *)&local_60);
  }
  local_60.m_el[0].m_floats[0] = (float)iterations;
  btVector3::operator/=(v,(btScalar *)&local_60);
  return;
}

Assistant:

void				btSoftBody::LJoint::Prepare(btScalar dt,int iterations)
{
	static const btScalar	maxdrift=4;
	Joint::Prepare(dt,iterations);
	m_rpos[0]		=	m_bodies[0].xform()*m_refs[0];
	m_rpos[1]		=	m_bodies[1].xform()*m_refs[1];
	m_drift			=	Clamp(m_rpos[0]-m_rpos[1],maxdrift)*m_erp/dt;
	m_rpos[0]		-=	m_bodies[0].xform().getOrigin();
	m_rpos[1]		-=	m_bodies[1].xform().getOrigin();
	m_massmatrix	=	ImpulseMatrix(	m_bodies[0].invMass(),m_bodies[0].invWorldInertia(),m_rpos[0],
		m_bodies[1].invMass(),m_bodies[1].invWorldInertia(),m_rpos[1]);
	if(m_split>0)
	{
		m_sdrift	=	m_massmatrix*(m_drift*m_split);
		m_drift		*=	1-m_split;
	}
	m_drift	/=(btScalar)iterations;
}